

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Web_Constraint::Dependency_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  Am_Web_Data *pAVar1;
  Input_Port *ptr;
  Input_Port *pIVar2;
  Input_Port *pIVar3;
  Input_Port **ppIVar4;
  
  pAVar1 = this->owner;
  pIVar3 = (Input_Port *)0x0;
  ppIVar4 = &pAVar1->in_list;
  while( true ) {
    ptr = *ppIVar4;
    if (ptr == (Input_Port *)0x0) {
      return;
    }
    if ((ptr->context).data == removing_slot->data) break;
    ppIVar4 = &ptr->next;
    pIVar3 = ptr;
  }
  ppIVar4 = &pIVar3->next;
  if (pIVar3 == (Input_Port *)0x0) {
    ppIVar4 = &pAVar1->in_list;
  }
  *ppIVar4 = ptr->next;
  ptr->next = (Input_Port *)0x0;
  pIVar3 = ptr->prev_changed;
  if (pIVar3 != (Input_Port *)0x0) {
    pIVar3->next_changed = ptr->next_changed;
  }
  pIVar2 = ptr->next_changed;
  if (pAVar1->changed_first == ptr) {
    pAVar1->changed_first = pIVar2;
  }
  if (pIVar2 != (Input_Port *)0x0) {
    pIVar2->prev_changed = pIVar3;
  }
  if (pAVar1->changed_last == ptr) {
    pAVar1->changed_last = ptr->prev_changed;
  }
  ptr->next_changed = (Input_Port *)0x0;
  ptr->prev_changed = (Input_Port *)0x0;
  pIVar3 = (Input_Port *)0x0;
  ppIVar4 = &pAVar1->invalid_list;
  do {
    pIVar2 = *ppIVar4;
    if (pIVar2 == (Input_Port *)0x0) {
LAB_001d94e3:
      ptr->next_invalid = (Input_Port *)0x0;
      Am_Value::~Am_Value(&ptr->prev_value);
      Input_Port::operator_delete(ptr,0x48);
      pAVar1 = this->owner;
      if (pAVar1->in_list != (Input_Port *)0x0) {
        return;
      }
      if (pAVar1->out_list != (Output_Port *)0x0) {
        return;
      }
      Am_Web_Data::~Am_Web_Data(pAVar1);
      operator_delete(pAVar1);
      return;
    }
    if (pIVar2 == ptr) {
      ppIVar4 = &pIVar3->next_invalid;
      if (pIVar3 == (Input_Port *)0x0) {
        ppIVar4 = &pAVar1->invalid_list;
      }
      *ppIVar4 = pIVar2->next_invalid;
      goto LAB_001d94e3;
    }
    ppIVar4 = &pIVar2->next_invalid;
    pIVar3 = pIVar2;
  } while( true );
}

Assistant:

void
Web_Constraint::Dependency_Removed(const Am_Slot &removing_slot)
{
  Input_Port *prev = nullptr;
  Input_Port *port = owner->in_list;
  while (port) {
    if (port->context == removing_slot) {
      if (prev)
        prev->next = port->next;
      else
        owner->in_list = port->next;
      port->next = nullptr;
      if (port->prev_changed)
        port->prev_changed->next_changed = port->next_changed;
      if (owner->changed_first == port)
        owner->changed_first = port->next_changed;
      if (port->next_changed)
        port->next_changed->prev_changed = port->prev_changed;
      if (owner->changed_last == port)
        owner->changed_last = port->prev_changed;
      port->next_changed = nullptr;
      port->prev_changed = nullptr;
      prev = nullptr;
      Input_Port *curr = owner->invalid_list;
      while (curr) {
        if (curr == port) {
          if (prev)
            prev->next_invalid = curr->next_invalid;
          else
            owner->invalid_list = curr->next_invalid;
          break;
        }
        prev = curr;
        curr = curr->next_invalid;
      }
      port->next_invalid = nullptr;
      delete port;
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = port;
    port = port->next;
  }
}